

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

timediff_t Curl_timeleft(Curl_easy *data,curltime *nowp,_Bool duringconnect)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  int *piVar4;
  timediff_t tVar5;
  timediff_t tVar6;
  undefined7 in_register_00000011;
  long lVar7;
  curltime older;
  curltime cVar8;
  int local_28 [2];
  time_t local_20;
  
  piVar4 = local_28;
  lVar7 = (data->set).timeout;
  bVar2 = 0 < lVar7;
  cVar3 = bVar2;
  if (((int)CONCAT71(in_register_00000011,duringconnect) != 0) &&
     (cVar3 = bVar2 + '\x02', (data->set).connecttimeout < 1)) {
    cVar3 = bVar2;
  }
  if (cVar3 != '\x01') {
    if (cVar3 == '\x03') {
      lVar1 = (data->set).connecttimeout;
      if (lVar1 <= lVar7) {
        lVar7 = lVar1;
      }
    }
    else if (cVar3 == '\x02') {
      lVar7 = (data->set).connecttimeout;
    }
    else {
      lVar7 = 300000;
      if (!duringconnect) {
        return 0;
      }
    }
  }
  if (nowp == (curltime *)0x0) {
    cVar8 = Curl_now();
    nowp = (curltime *)&local_20;
    local_20 = cVar8.tv_sec;
    local_28[0] = cVar8.tv_usec;
  }
  else {
    piVar4 = &nowp->tv_usec;
  }
  cVar8.tv_usec = *piVar4;
  cVar8.tv_sec = nowp->tv_sec;
  cVar8._12_4_ = 0;
  older.tv_usec = (int)(data->progress).speeder[(ulong)!duringconnect * 2 + -0xb];
  older.tv_sec = (data->progress).speeder[(ulong)!duringconnect * 2 + -0xc];
  older._12_4_ = 0;
  tVar5 = Curl_timediff(cVar8,older);
  tVar6 = -1;
  if (lVar7 - tVar5 != 0) {
    tVar6 = lVar7 - tVar5;
  }
  return tVar6;
}

Assistant:

timediff_t Curl_timeleft(struct Curl_easy *data,
                         struct curltime *nowp,
                         bool duringconnect)
{
  int timeout_set = 0;
  timediff_t timeout_ms = duringconnect?DEFAULT_CONNECT_TIMEOUT:0;
  struct curltime now;

  /* if a timeout is set, use the most restrictive one */

  if(data->set.timeout > 0)
    timeout_set |= 1;
  if(duringconnect && (data->set.connecttimeout > 0))
    timeout_set |= 2;

  switch(timeout_set) {
  case 1:
    timeout_ms = data->set.timeout;
    break;
  case 2:
    timeout_ms = data->set.connecttimeout;
    break;
  case 3:
    if(data->set.timeout < data->set.connecttimeout)
      timeout_ms = data->set.timeout;
    else
      timeout_ms = data->set.connecttimeout;
    break;
  default:
    /* use the default */
    if(!duringconnect)
      /* if we're not during connect, there's no default timeout so if we're
         at zero we better just return zero and not make it a negative number
         by the math below */
      return 0;
    break;
  }

  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }

  /* subtract elapsed time */
  if(duringconnect)
    /* since this most recent connect started */
    timeout_ms -= Curl_timediff(*nowp, data->progress.t_startsingle);
  else
    /* since the entire operation started */
    timeout_ms -= Curl_timediff(*nowp, data->progress.t_startop);
  if(!timeout_ms)
    /* avoid returning 0 as that means no timeout! */
    return -1;

  return timeout_ms;
}